

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Type_Conversion chaiscript::type_conversion<char_const*,std::__cxx11::string>(void)

{
  Type_Conversion_Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Type_Conversion TVar1;
  
  __p = (Type_Conversion_Base *)operator_new(0x40);
  (__p->m_from).m_type_info = (type_info *)&char_const*::typeinfo;
  (__p->m_from).m_bare_type_info = (type_info *)&char::typeinfo;
  (__p->m_from).m_flags = 5;
  (__p->m_to).m_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  (__p->m_to).m_bare_type_info = (type_info *)&std::__cxx11::string::typeinfo;
  (__p->m_to).m_flags = 0;
  __p->_vptr_Type_Conversion_Base = (_func_int **)&PTR_convert_00179470;
  in_RDI->_vptr_Type_Conversion_Base = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::detail::Type_Conversion_Base*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->m_to,__p);
  TVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  TVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Type_Conversion)
         TVar1.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Type_Conversion type_conversion() {
    static_assert(std::is_convertible<From, To>::value, "Types are not automatically convertible");
    auto func = [](const Boxed_Value &t_bv) -> Boxed_Value {
      // not even attempting to call boxed_cast so that we don't get caught in some call recursion
      return chaiscript::Boxed_Value(To(detail::Cast_Helper<From>::cast(t_bv, nullptr)));
    };

    return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Type_Conversion_Impl<decltype(func)>>(user_type<From>(),
                                                                                                               user_type<To>(),
                                                                                                               func);
  }